

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_utils_basis.h
# Opt level: O0

int __thiscall
ktx::OptionsEncodeBasis<false>::init(OptionsEncodeBasis<false> *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  shared_ptr<cxxopts::Value> *in_stack_fffffffffffff328;
  shared_ptr<const_cxxopts::Value> *in_stack_fffffffffffff330;
  allocator<char> *in_stack_fffffffffffff360;
  allocator<char> *__a;
  char *in_stack_fffffffffffff368;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *in_stack_fffffffffffff380;
  Options *in_stack_fffffffffffff388;
  string *in_stack_fffffffffffff450;
  string *arg_help;
  shared_ptr<const_cxxopts::Value> *in_stack_fffffffffffff458;
  shared_ptr<const_cxxopts::Value> *value;
  string *in_stack_fffffffffffff460;
  string *desc;
  string *in_stack_fffffffffffff468;
  string *opts;
  OptionAdder *in_stack_fffffffffffff470;
  OptionAdder *this_01;
  allocator<char> local_a39;
  string local_a38 [71];
  allocator<char> local_9f1;
  string local_9f0 [39];
  allocator<char> local_9c9;
  string local_9c8 [39];
  allocator<char> local_9a1;
  string local_9a0 [71];
  allocator<char> local_959;
  string local_958 [39];
  undefined1 local_931 [40];
  allocator<char> local_909;
  string local_908 [71];
  allocator<char> local_8c1;
  string local_8c0 [39];
  allocator<char> local_899;
  string local_898 [39];
  allocator<char> local_871;
  string local_870 [71];
  allocator<char> local_829;
  string local_828 [39];
  allocator<char> local_801;
  string local_800 [39];
  allocator<char> local_7d9;
  string local_7d8 [71];
  allocator<char> local_791;
  string local_790 [39];
  allocator<char> local_769;
  string local_768 [39];
  allocator<char> local_741;
  string local_740 [71];
  allocator<char> local_6f9;
  string local_6f8 [39];
  allocator<char> local_6d1;
  string local_6d0 [39];
  allocator<char> local_6a9;
  string local_6a8 [71];
  allocator<char> local_661;
  string local_660 [39];
  allocator<char> local_639;
  string local_638 [39];
  allocator<char> local_611;
  string local_610 [71];
  undefined1 local_5c9 [40];
  undefined1 local_5a1 [40];
  undefined1 local_579 [80];
  allocator<char> local_529;
  string local_528 [71];
  allocator<char> local_4e1;
  string local_4e0 [39];
  allocator<char> local_4b9;
  string local_4b8 [39];
  allocator<char> local_491;
  string local_490 [71];
  allocator<char> local_449;
  string local_448 [39];
  allocator<char> local_421;
  string local_420 [39];
  allocator<char> local_3f9;
  string local_3f8 [71];
  allocator<char> local_3b1;
  string local_3b0 [39];
  allocator<char> local_389;
  string local_388 [39];
  allocator<char> local_361;
  string local_360 [71];
  allocator<char> local_319;
  string local_318 [39];
  allocator<char> local_2f1;
  string local_2f0 [39];
  allocator<char> local_2c9;
  string local_2c8 [71];
  allocator<char> local_281;
  string local_280 [39];
  allocator<char> local_259;
  string local_258 [39];
  allocator<char> local_231;
  string local_230 [71];
  allocator<char> local_1e9;
  string local_1e8 [39];
  allocator<char> local_1c1;
  string local_1c0 [39];
  allocator<char> local_199;
  string local_198 [71];
  allocator<char> local_151;
  string local_150 [39];
  allocator<char> local_129;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [71];
  allocator<char> local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [55];
  allocator<char> local_59;
  string local_58 [72];
  string *local_10;
  OptionsEncodeBasis<false> *local_8;
  
  local_10 = (string *)ctx;
  local_8 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  cxxopts::Options::add_options(in_stack_fffffffffffff388,in_stack_fffffffffffff380);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  cxxopts::value<unsigned_int>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffff330,in_stack_fffffffffffff328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  cxxopts::OptionAdder::operator()
            (in_stack_fffffffffffff470,in_stack_fffffffffffff468,in_stack_fffffffffffff460,
             in_stack_fffffffffffff458,in_stack_fffffffffffff450);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  cxxopts::value<unsigned_int>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffff330,in_stack_fffffffffffff328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  cxxopts::OptionAdder::operator()
            (in_stack_fffffffffffff470,in_stack_fffffffffffff468,in_stack_fffffffffffff460,
             in_stack_fffffffffffff458,in_stack_fffffffffffff450);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  cxxopts::value<unsigned_int>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffff330,in_stack_fffffffffffff328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  cxxopts::OptionAdder::operator()
            (in_stack_fffffffffffff470,in_stack_fffffffffffff468,in_stack_fffffffffffff460,
             in_stack_fffffffffffff458,in_stack_fffffffffffff450);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  cxxopts::value<float>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffff330,in_stack_fffffffffffff328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  cxxopts::OptionAdder::operator()
            (in_stack_fffffffffffff470,in_stack_fffffffffffff468,in_stack_fffffffffffff460,
             in_stack_fffffffffffff458,in_stack_fffffffffffff450);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  cxxopts::value<unsigned_int>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffff330,in_stack_fffffffffffff328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  cxxopts::OptionAdder::operator()
            (in_stack_fffffffffffff470,in_stack_fffffffffffff468,in_stack_fffffffffffff460,
             in_stack_fffffffffffff458,in_stack_fffffffffffff450);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  cxxopts::value<float>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffff330,in_stack_fffffffffffff328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  cxxopts::OptionAdder::operator()
            (in_stack_fffffffffffff470,in_stack_fffffffffffff468,in_stack_fffffffffffff460,
             in_stack_fffffffffffff458,in_stack_fffffffffffff450);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffff330,in_stack_fffffffffffff328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  cxxopts::OptionAdder::operator()
            (in_stack_fffffffffffff470,in_stack_fffffffffffff468,in_stack_fffffffffffff460,
             in_stack_fffffffffffff458,in_stack_fffffffffffff450);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffff330,in_stack_fffffffffffff328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  cxxopts::OptionAdder::operator()
            (in_stack_fffffffffffff470,in_stack_fffffffffffff468,in_stack_fffffffffffff460,
             in_stack_fffffffffffff458,in_stack_fffffffffffff450);
  std::__cxx11::string::~string(local_528);
  std::allocator<char>::~allocator(&local_529);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x20c2a8);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x20c2b5);
  std::__cxx11::string::~string(local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  std::__cxx11::string::~string(local_4b8);
  std::allocator<char>::~allocator(&local_4b9);
  std::__cxx11::string::~string(local_490);
  std::allocator<char>::~allocator(&local_491);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x20c310);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x20c31d);
  std::__cxx11::string::~string(local_448);
  std::allocator<char>::~allocator(&local_449);
  std::__cxx11::string::~string(local_420);
  std::allocator<char>::~allocator(&local_421);
  std::__cxx11::string::~string(local_3f8);
  std::allocator<char>::~allocator(&local_3f9);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x20c378);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x20c385);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator(&local_389);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator(&local_361);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x20c3e0);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x20c3ed);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator(&local_319);
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x20c448);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x20c455);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator(&local_281);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator(&local_259);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator(&local_231);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x20c4b0);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x20c4bd);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator(&local_199);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x20c518);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x20c525);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x20c580);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x20c58d);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  cxxopts::OptionAdder::~OptionAdder((OptionAdder *)0x20c5ce);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  this_01 = (OptionAdder *)local_579;
  opts = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  cxxopts::Options::add_options(in_stack_fffffffffffff388,in_stack_fffffffffffff380);
  desc = (string *)local_5a1;
  value = (shared_ptr<const_cxxopts::Value> *)kUastcQuality;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  arg_help = (string *)local_5c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  cxxopts::value<unsigned_int>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffff330,in_stack_fffffffffffff328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  cxxopts::OptionAdder::operator()(this_01,opts,desc,value,arg_help);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffff330,in_stack_fffffffffffff328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  cxxopts::OptionAdder::operator()(this_01,opts,desc,value,arg_help);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  cxxopts::value<float>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffff330,in_stack_fffffffffffff328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  cxxopts::OptionAdder::operator()(this_01,opts,desc,value,arg_help);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  cxxopts::value<unsigned_int>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffff330,in_stack_fffffffffffff328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  cxxopts::OptionAdder::operator()(this_01,opts,desc,value,arg_help);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  cxxopts::value<float>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffff330,in_stack_fffffffffffff328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  cxxopts::OptionAdder::operator()(this_01,opts,desc,value,arg_help);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  cxxopts::value<float>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffff330,in_stack_fffffffffffff328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  cxxopts::OptionAdder::operator()(this_01,opts,desc,value,arg_help);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_931;
  __s = kUastcRdoF;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,in_stack_fffffffffffff360);
  __a = &local_959;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffff330,in_stack_fffffffffffff328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
  cxxopts::OptionAdder::operator()(this_01,opts,desc,value,arg_help);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffff330,in_stack_fffffffffffff328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
  cxxopts::OptionAdder::operator()(this_01,opts,desc,value,arg_help);
  std::__cxx11::string::~string(local_a38);
  std::allocator<char>::~allocator(&local_a39);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x20ce2f);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x20ce3c);
  std::__cxx11::string::~string(local_9f0);
  std::allocator<char>::~allocator(&local_9f1);
  std::__cxx11::string::~string(local_9c8);
  std::allocator<char>::~allocator(&local_9c9);
  std::__cxx11::string::~string(local_9a0);
  std::allocator<char>::~allocator(&local_9a1);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x20ce97);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x20cea4);
  std::__cxx11::string::~string(local_958);
  std::allocator<char>::~allocator(&local_959);
  std::__cxx11::string::~string((string *)(local_931 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_931);
  std::__cxx11::string::~string(local_908);
  std::allocator<char>::~allocator(&local_909);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x20ceff);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x20cf0c);
  std::__cxx11::string::~string(local_8c0);
  std::allocator<char>::~allocator(&local_8c1);
  std::__cxx11::string::~string(local_898);
  std::allocator<char>::~allocator(&local_899);
  std::__cxx11::string::~string(local_870);
  std::allocator<char>::~allocator(&local_871);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x20cf67);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x20cf74);
  std::__cxx11::string::~string(local_828);
  std::allocator<char>::~allocator(&local_829);
  std::__cxx11::string::~string(local_800);
  std::allocator<char>::~allocator(&local_801);
  std::__cxx11::string::~string(local_7d8);
  std::allocator<char>::~allocator(&local_7d9);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x20cfcf);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x20cfdc);
  std::__cxx11::string::~string(local_790);
  std::allocator<char>::~allocator(&local_791);
  std::__cxx11::string::~string(local_768);
  std::allocator<char>::~allocator(&local_769);
  std::__cxx11::string::~string(local_740);
  std::allocator<char>::~allocator(&local_741);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x20d037);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x20d044);
  std::__cxx11::string::~string(local_6f8);
  std::allocator<char>::~allocator(&local_6f9);
  std::__cxx11::string::~string(local_6d0);
  std::allocator<char>::~allocator(&local_6d1);
  std::__cxx11::string::~string(local_6a8);
  std::allocator<char>::~allocator(&local_6a9);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x20d09f);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x20d0ac);
  std::__cxx11::string::~string(local_660);
  std::allocator<char>::~allocator(&local_661);
  std::__cxx11::string::~string(local_638);
  std::allocator<char>::~allocator(&local_639);
  std::__cxx11::string::~string(local_610);
  std::allocator<char>::~allocator(&local_611);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x20d107);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x20d114);
  std::__cxx11::string::~string((string *)(local_5c9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_5c9);
  std::__cxx11::string::~string((string *)(local_5a1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_5a1);
  cxxopts::OptionAdder::~OptionAdder((OptionAdder *)0x20d155);
  std::__cxx11::string::~string((string *)(local_579 + 1));
  iVar1 = std::allocator<char>::~allocator((allocator<char> *)local_579);
  return iVar1;
}

Assistant:

void init(cxxopts::Options& opts) {
        opts.add_options("Encode BasisLZ")
            (kCLevel, "BasisLZ compression level, an encoding speed vs. quality level tradeoff. "
                "Range is [0,6], default is 1. Higher values are slower but give higher quality.",
                cxxopts::value<uint32_t>(), "<level>")
            (kQLevel, "BasisLZ quality level. Range is [1,255]. Lower gives better compression/lower "
                "quality/faster. Higher gives less compression/higher quality/slower. --qlevel "
                "automatically determines values for --max-endpoints, --max-selectors, "
                "--endpoint-rdo-threshold and --selector-rdo-threshold for the target quality level. "
                "Setting these options overrides the values determined by --qlevel which defaults to "
                "128 if neither it nor --max-endpoints and --max-selectors have been set.",
                cxxopts::value<uint32_t>(), "<level>")
            (kMaxEndpoints, "Manually set the maximum number of color endpoint clusters. Range "
                "is [1,16128]. Default is 0, unset.",
                cxxopts::value<uint32_t>(), "<arg>")
            (kEndpointRdoThreshold, "Set endpoint RDO quality threshold. The default is 1.25. Lower "
                "is higher quality but less quality per output bit (try [1.0,3.0]). This will override "
                "the value chosen by --qlevel.", cxxopts::value<float>(), "<arg>")
            (kMaxSelectors, "Manually set the maximum number of color selector clusters from [1,16128]. "
                "Default is 0, unset.", cxxopts::value<uint32_t>(), "<arg>")
            (kSelectorRdoThreshold, "Set selector RDO quality threshold. The default is 1.25. Lower "
                "is higher quality but less quality per output bit (try [1.0,3.0]). This will override "
                "the value chosen by --qlevel.", cxxopts::value<float>(), "<arg>")
            (kNoEndpointRdo, "Disable endpoint rate distortion optimizations. Slightly faster, "
                "less noisy output, but lower quality per output bit. Default is to do endpoint RDO.")
            (kNoSelectorRdo, "Disable selector rate distortion optimizations. Slightly faster, "
                "less noisy output, but lower quality per output bit. Default is to do selector RDO.");
        opts.add_options("Encode UASTC")
            (kUastcQuality, "UASTC compression level, an encoding speed vs. quality level tradeoff. "
                "Range is [0,4], default is 1. Higher values are slower but give higher quality.",
                cxxopts::value<uint32_t>(), "<level>")
            (kUastcRdo, "Enable UASTC RDO post-processing.")
            (kUastcRdoL, "Set UASTC RDO quality scalar to the specified value. Lower values yield "
                "higher quality/larger supercompressed files, higher values yield lower quality/smaller "
                "supercompressed files. A good range to try is [.25,10]. For normal maps a good range is "
                "[.25,.75]. The full range is [.001,10.0]. Default is 1.0.",
                cxxopts::value<float>(), "<lambda>")
            (kUastcRdoD, "Set UASTC RDO dictionary size in bytes. Default is 4096. Lower values=faster, "
                "but give less compression. Range is [64,65536].",
                cxxopts::value<uint32_t>(), "<dictsize>")
            (kUastcRdoB, "Set UASTC RDO max smooth block error scale. Range is [1.0,300.0]. Default "
                "is 10.0, 1.0 is disabled. Larger values suppress more artifacts (and allocate more bits) "
                "on smooth blocks.", cxxopts::value<float>(), "<scale>")
            (kUastcRdoS, "Set UASTC RDO max smooth block standard deviation. Range is [.01,65536.0]. "
                "Default is 18.0. Larger values expand the range of blocks considered smooth.",
                cxxopts::value<float>(), "<deviation>")
            (kUastcRdoF, "Do not favor simpler UASTC modes in RDO mode.")
            (kUastcRdoM, "Disable RDO multithreading (slightly higher compression, deterministic).");
    }